

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O3

void Kf_SetMergeOrder(Kf_Set_t *p,int *pCuts0,int *pCuts1,int fArea,int fCutMin)

{
  Kf_Cut_t *pKVar1;
  int *piVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  Kf_Cut_t *pKVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  int *piVar15;
  int iVar16;
  int nSizeB;
  long lVar17;
  int iVar18;
  int iVar19;
  Kf_Cut_t *pKVar20;
  uint uVar21;
  long lVar22;
  bool bVar23;
  
  Kf_SetPrepare(p,pCuts0,pCuts1);
  iVar5 = p->nCuts0;
  uVar11 = (ulong)(uint)p->nCuts1;
  p->CutCount[0] = p->CutCount[0] + (long)(p->nCuts1 * iVar5);
  if (0 < iVar5) {
    piVar15 = p->pCuts0[0].pLeaves;
    pKVar20 = p->pCuts0;
    do {
      if (0 < (int)uVar11) {
        uVar3 = p->nLutSize;
        uVar7 = (ulong)uVar3;
        pKVar8 = p->pCuts1;
        piVar14 = p->pCuts1[0].pLeaves;
        do {
          uVar9 = pKVar20->nLeaves;
          uVar21 = pKVar8->nLeaves;
          uVar6 = (uint)uVar3;
          if (((int)(uVar21 + uVar9) <= (int)(uint)uVar3) ||
             (uVar11 = pKVar8->Sign | pKVar20->Sign,
             uVar11 = uVar11 - (uVar11 >> 1 & 0x5555555555555555),
             uVar11 = (uVar11 >> 2 & 0x3333333333333333) + (uVar11 & 0x3333333333333333),
             (byte)(((uVar11 >> 4) + uVar11 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) <=
             uVar6)) {
            p->CutCount[1] = p->CutCount[1] + 1;
            iVar5 = p->nCuts;
            pKVar1 = p->pCutsR + iVar5;
            if ((uVar9 == uVar6) && (uVar21 == uVar6)) {
              if (uVar6 == 0) {
                uVar11 = 0;
              }
              else {
                uVar12 = 0;
                do {
                  if (piVar15[uVar12] != piVar14[uVar12]) goto LAB_00768950;
                  pKVar1->pLeaves[uVar12] = piVar15[uVar12];
                  uVar12 = uVar12 + 1;
                  uVar11 = uVar7;
                } while (uVar7 != uVar12);
              }
LAB_007687fe:
              uVar21 = (uint)uVar11;
              pKVar1->nLeaves = uVar21;
              p->CutCount[2] = p->CutCount[2] + 1;
              uVar12 = pKVar8->Sign | pKVar20->Sign;
              pKVar1->Sign = uVar12;
              uVar9 = p->pList[(int)uVar21];
              if (-1 < (int)uVar9) {
                do {
                  if (p->pCutsR[uVar9].Sign == uVar12) {
                    uVar6 = p->pCutsR[uVar9].nLeaves;
                    if (uVar6 == uVar21) {
                      if ((int)uVar21 < 1) goto LAB_00768950;
                      uVar13 = 0;
                      while (p->pCutsR[uVar9].pLeaves[uVar13] == pKVar1->pLeaves[uVar13]) {
                        uVar13 = uVar13 + 1;
                        if ((uVar11 & 0xffffffff) == uVar13) goto LAB_00768950;
                      }
                    }
                    else {
                      if ((int)uVar6 <= (int)uVar21) {
LAB_00768b1d:
                        __assert_fail("nSizeB > nSizeC",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                                      ,0x29f,"int Kf_SetCutIsContainedOrder(Kf_Cut_t *, Kf_Cut_t *)"
                                     );
                      }
                      if (0 < (int)uVar6) {
                        uVar13 = 0;
                        uVar10 = 0;
                        do {
                          iVar18 = p->pCutsR[uVar9].pLeaves[uVar13];
                          if (pKVar1->pLeaves[(int)uVar10] < iVar18) break;
                          if ((iVar18 == pKVar1->pLeaves[(int)uVar10]) &&
                             (uVar10 = uVar10 + 1, uVar10 == uVar21)) goto LAB_00768950;
                          uVar13 = uVar13 + 1;
                        } while (uVar6 != uVar13);
                      }
                    }
                  }
                  uVar9 = p->pCutsR[uVar9].iNext;
                } while (-1 < (int)uVar9);
              }
              p->nCuts = p->nCuts + 1;
              if ((int)uVar21 < 2) {
                __assert_fail("pCutR->nLeaves > 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                              ,0x330,"void Kf_SetMergeOrder(Kf_Set_t *, int *, int *, int, int)");
              }
              iVar18 = pKVar8->Delay;
              if (pKVar8->Delay < pKVar20->Delay) {
                iVar18 = pKVar20->Delay;
              }
              pKVar1->Delay = iVar18;
              pKVar1->Area = pKVar20->Area + pKVar8->Area;
              pKVar1->iNext = p->pList[(int)uVar21];
              p->pList[(int)uVar21] = iVar5;
            }
            else if (uVar7 != 0) {
              uVar11 = 0;
              iVar16 = 0;
              iVar18 = 0;
LAB_007687a0:
              iVar19 = pKVar20->pLeaves[iVar18];
              iVar4 = pKVar8->pLeaves[iVar16];
              if (iVar19 < iVar4) {
                iVar18 = iVar18 + 1;
                pKVar1->pLeaves[uVar11] = iVar19;
                iVar19 = iVar16;
                if (iVar18 < (int)uVar9) goto LAB_007687ee;
LAB_00768906:
                if ((int)(uVar21 + (int)uVar11 + 1) <= (int)(iVar19 + (uint)uVar3)) {
                  if ((int)uVar21 <= iVar19) goto LAB_007689a1;
                  lVar17 = (long)iVar19;
                  do {
                    piVar2 = piVar14 + lVar17;
                    lVar17 = lVar17 + 1;
                    p->pCutsR[iVar5].pLeaves[uVar11 + 1] = *piVar2;
                    uVar11 = uVar11 + 1;
                  } while ((int)uVar21 != lVar17);
LAB_00768999:
                  uVar11 = (ulong)((int)uVar11 + 1);
                  goto LAB_007687fe;
                }
              }
              else {
                if (iVar4 < iVar19) {
                  pKVar1->pLeaves[uVar11] = iVar4;
                }
                else {
                  iVar18 = iVar18 + 1;
                  pKVar1->pLeaves[uVar11] = iVar19;
                  iVar19 = iVar16 + 1;
                  if ((int)uVar9 <= iVar18) goto LAB_00768906;
                }
                iVar16 = iVar16 + 1;
                if (iVar16 < (int)uVar21) goto LAB_007687ee;
                if ((int)(uVar9 + (int)uVar11 + 1) <= (int)(iVar18 + (uint)uVar3)) {
                  if (iVar18 < (int)uVar9) {
                    lVar17 = (long)iVar18;
                    do {
                      piVar2 = piVar15 + lVar17;
                      lVar17 = lVar17 + 1;
                      p->pCutsR[iVar5].pLeaves[uVar11 + 1] = *piVar2;
                      uVar11 = uVar11 + 1;
                    } while ((int)uVar9 != lVar17);
                    goto LAB_00768999;
                  }
LAB_007689a1:
                  uVar11 = uVar11 + 1;
                  goto LAB_007687fe;
                }
              }
            }
          }
LAB_00768950:
          pKVar8 = pKVar8 + 1;
          uVar11 = (ulong)p->nCuts1;
          piVar14 = piVar14 + 0x18;
        } while (pKVar8 < p->pCuts1 + uVar11);
        iVar5 = p->nCuts0;
      }
      pKVar20 = pKVar20 + 1;
      piVar15 = piVar15 + 0x18;
    } while (pKVar20 < p->pCuts0 + iVar5);
  }
  if (p->nCuts < 1) {
    __assert_fail("p->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                  ,0x2f0,"void Kf_SetFilterOrder(Kf_Set_t *)");
  }
  uVar3 = p->nLutSize;
  pKVar20 = p->pCutsR;
  uVar11 = 0;
  do {
    uVar9 = p->pList[uVar11];
    if (-1 < (int)uVar9) {
      piVar15 = p->pList + uVar11;
      do {
        pKVar8 = pKVar20 + uVar9;
        iVar5 = p->pCutsR[uVar9].nLeaves;
        lVar17 = (long)iVar5;
        iVar18 = 0;
        if (0 < lVar17) {
LAB_00768a1f:
          uVar9 = p->pList[iVar18];
          if (-1 < (int)uVar9) {
            do {
              if ((pKVar20[uVar9].Sign & ~pKVar8->Sign) == 0) {
                iVar16 = pKVar20[uVar9].nLeaves;
                if (iVar5 == iVar16) {
                  lVar22 = 0;
                  while (pKVar8->pLeaves[lVar22] == pKVar20[uVar9].pLeaves[lVar22]) {
                    lVar22 = lVar22 + 1;
                    if (lVar17 == lVar22) goto LAB_00768a9b;
                  }
                }
                else {
                  if (iVar5 <= iVar16) goto LAB_00768b1d;
                  lVar22 = 0;
                  iVar19 = 0;
                  do {
                    if (pKVar20[uVar9].pLeaves[iVar19] < pKVar8->pLeaves[lVar22]) break;
                    if ((pKVar8->pLeaves[lVar22] == pKVar20[uVar9].pLeaves[iVar19]) &&
                       (iVar19 = iVar19 + 1, iVar19 == iVar16)) goto LAB_00768a9b;
                    lVar22 = lVar22 + 1;
                  } while (lVar17 != lVar22);
                }
              }
              uVar9 = pKVar20[uVar9].iNext;
            } while (-1 < (int)uVar9);
          }
          goto LAB_00768aa2;
        }
LAB_00768aae:
        piVar14 = &pKVar8->iNext;
        if (iVar18 == iVar5 + 1) {
          uVar9 = *piVar14;
          *piVar15 = uVar9;
          piVar14 = piVar15;
        }
        else {
          uVar9 = *piVar14;
        }
        piVar15 = piVar14;
      } while (-1 < (int)uVar9);
    }
    bVar23 = uVar11 == uVar3;
    uVar11 = uVar11 + 1;
    if (bVar23) {
      iVar5 = p->nCuts;
      if (iVar5 < 1) {
        __assert_fail("p->nCuts > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                      ,0x2fd,"void Kf_SetFilterOrder(Kf_Set_t *)");
      }
      iVar18 = p->nCutNum - 1;
      if (iVar5 < iVar18) {
        iVar18 = iVar5;
      }
      p->CutCount[3] = p->CutCount[3] + (long)iVar18;
      Kf_SetSelectBest(p,fArea,(int)pKVar20);
      return;
    }
  } while( true );
LAB_007687ee:
  uVar11 = uVar11 + 1;
  if (uVar7 == uVar11) goto LAB_00768950;
  goto LAB_007687a0;
LAB_00768a9b:
  p->nCuts = p->nCuts + -1;
  iVar18 = iVar5;
LAB_00768aa2:
  iVar18 = iVar18 + 1;
  if (iVar5 <= iVar18) goto LAB_00768aae;
  goto LAB_00768a1f;
}

Assistant:

static inline void Kf_SetMergeOrder( Kf_Set_t * p, int * pCuts0, int * pCuts1, int fArea, int fCutMin )
{
    Kf_Cut_t * pCut0, * pCut1, * pCutR;
    Kf_SetPrepare( p, pCuts0, pCuts1 );
    p->CutCount[0] += p->nCuts0 * p->nCuts1;
    for ( pCut0 = p->pCuts0; pCut0 < p->pCuts0 + p->nCuts0; pCut0++ )
    for ( pCut1 = p->pCuts1; pCut1 < p->pCuts1 + p->nCuts1; pCut1++ )
    {
        if ( pCut0->nLeaves + pCut1->nLeaves > p->nLutSize && Kf_SetCountBits(pCut0->Sign | pCut1->Sign) > p->nLutSize )
            continue;
        p->CutCount[1]++;        
        pCutR = p->pCutsR + p->nCuts;
        if ( !Kf_SetMergeOrderOne(pCut0, pCut1, pCutR, p->nLutSize) )
            continue;
        p->CutCount[2]++;        
        pCutR->Sign = pCut0->Sign | pCut1->Sign;
        if ( Kf_SetRemoveDuplicatesOrder(p, pCutR) )
            continue;
        p->nCuts++;
        if ( fCutMin )
        {
            int nOldSupp = pCutR->nLeaves;
//            pCutR->iFunc = Kf_SetComputeTruth( p, pCut0->iFunc, pCut1->iFunc, pCut0, pCut1, pCutR );
            assert( pCutR->nLeaves <= nOldSupp );
            if ( pCutR->nLeaves < nOldSupp )
                pCutR->Sign = Kf_SetCutGetSign( pCutR );
            // delay and area are inaccurate
        }
        assert( pCutR->nLeaves > 1 );
        pCutR->Delay = Abc_MaxInt(pCut0->Delay, pCut1->Delay);
        pCutR->Area  = pCut0->Area + pCut1->Area;
        // add new cut
        Kf_SetAddToList( p, pCutR, 0 );
    }
    Kf_SetFilterOrder( p );
//    Kf_CheckCuts( p );
    p->CutCount[3] += Abc_MinInt( p->nCuts, p->nCutNum-1 );
    Kf_SetSelectBest( p, fArea, 1 );
}